

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O0

DWORD __thiscall TSparseArray::FindGroup_Items0(TSparseArray *this,DWORD index)

{
  uint uVar1;
  uint *puVar2;
  _BASEVALS *p_Var3;
  uint local_1c;
  DWORD middleValue;
  DWORD maxGroup;
  DWORD minGroup;
  DWORD index_local;
  TSparseArray *this_local;
  
  puVar2 = TGenericArray<unsigned_int>::operator[](&this->IndexToItem0,(ulong)(index >> 9));
  middleValue = *puVar2 >> 9;
  puVar2 = TGenericArray<unsigned_int>::operator[](&this->IndexToItem0,(ulong)((index >> 9) + 1));
  local_1c = *puVar2 + 0x1ff >> 9;
  uVar1 = middleValue;
  if (local_1c - middleValue < 10) {
    for (; p_Var3 = TGenericArray<_BASEVALS>::operator[](&this->BaseVals,(ulong)(middleValue + 1)),
        (middleValue * 0x200 - p_Var3->BaseValue200) + 0x200 <= index; middleValue = middleValue + 1
        ) {
    }
  }
  else {
    while (middleValue = uVar1, middleValue + 1 < local_1c) {
      uVar1 = local_1c + middleValue >> 1;
      p_Var3 = TGenericArray<_BASEVALS>::operator[](&this->BaseVals,(ulong)local_1c);
      if (index < local_1c * 0x200 - p_Var3->BaseValue200) {
        local_1c = uVar1;
        uVar1 = middleValue;
      }
    }
  }
  return middleValue;
}

Assistant:

DWORD FindGroup_Items0(DWORD index)
    {
        // Setup the group range to search
        DWORD minGroup = (IndexToItem0[INDEX_TO_GROUP(index) + 0]) >> 9;
        DWORD maxGroup = (IndexToItem0[INDEX_TO_GROUP(index) + 1] + 0x1FF) >> 9;

        // Search the groups and find the BASEVALS structure
        // For spans less than 10 groups, use sequential search, otherwise binary search.
        if ((maxGroup - minGroup) < 10)
        {
            // HOTS: 1959CF7
            while (index >= GROUP_TO_INDEX(minGroup) - BaseVals[minGroup + 1].BaseValue200 + 0x200)
            {
                // HOTS: 1959D14
                minGroup++;
            }
        }
        else
        {
            // HOTS: 1959D2E
            while ((minGroup + 1) < maxGroup)
            {
                // HOTS: 1959D38
                DWORD middleValue = (maxGroup + minGroup) >> 1;

                if (index < (maxGroup << 0x09) - BaseVals[maxGroup].BaseValue200)
                {
                    // HOTS: 01959D4B
                    maxGroup = middleValue;
                }
                else
                {
                    // HOTS: 1959D50
                    minGroup = middleValue;
                }
            }
        }

        return minGroup;
    }